

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_test.cc
# Opt level: O3

void __thiscall sample_after_nomalizing_basic::test_method(sample_after_nomalizing_basic *this)

{
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  int scode;
  undefined4 local_1a0;
  uint32_t chosen_index;
  undefined4 *local_198;
  int *local_190;
  undefined **local_188;
  ulong uStack_180;
  undefined8 *local_178;
  int **local_170;
  undefined **local_168;
  undefined1 local_160;
  undefined8 *local_158;
  undefined4 **local_150;
  vector<float,_std::allocator<float>_> pdf;
  shared_count sStack_120;
  vector<float,_std::allocator<float>_> expected;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_188 = (undefined **)0x400000003f800000;
  uStack_180 = 0x4080000040400000;
  local_178._0_4_ = 0x40a00000;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_188;
  std::vector<float,_std::allocator<float>_>::vector(&pdf,__l,(allocator_type *)&local_168);
  local_188 = (undefined **)0x3e0888893d888889;
  uStack_180 = 0x3e8888893e4ccccd;
  local_178 = (undefined8 *)CONCAT44(local_178._4_4_,0x3eaaaaab);
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_188;
  std::vector<float,_std::allocator<float>_>::vector(&expected,__l_00,(allocator_type *)&local_168);
  scode = exploration::
          sample_after_normalizing<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                    (0x1e6f,pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                     pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,&chosen_index);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x13);
  local_190 = &scode;
  local_198 = &local_1a0;
  local_1a0 = 0;
  sStack_120.pi_ = (sp_counted_base *)0x0;
  local_170 = &local_190;
  uStack_180 = uStack_180 & 0xffffffffffffff00;
  local_188 = &PTR__lazy_ostream_002ed980;
  local_178 = &boost::unit_test::lazy_ostream::inst;
  local_150 = &local_198;
  local_160 = 0;
  local_168 = &PTR__lazy_ostream_002ed980;
  local_158 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_120);
  check_float_vectors(&pdf,&expected,0.0001);
  scode = exploration::
          sample_after_normalizing<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                    (0x1e6f,pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                     pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,&chosen_index);
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x17);
  local_1a0 = 0;
  sStack_120.pi_ = (sp_counted_base *)0x0;
  local_190 = &scode;
  uStack_180 = uStack_180 & 0xffffffffffffff00;
  local_188 = &PTR__lazy_ostream_002ed980;
  local_178 = &boost::unit_test::lazy_ostream::inst;
  local_170 = &local_190;
  local_198 = &local_1a0;
  local_160 = 0;
  local_168 = &PTR__lazy_ostream_002ed980;
  local_158 = &boost::unit_test::lazy_ostream::inst;
  local_150 = &local_198;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_120);
  check_float_vectors(&pdf,&expected,0.0001);
  scode = exploration::
          sample_after_normalizing<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                    (0x1e6f,pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                     pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,&chosen_index);
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x1b);
  local_1a0 = 0;
  sStack_120.pi_ = (sp_counted_base *)0x0;
  local_190 = &scode;
  uStack_180 = uStack_180 & 0xffffffffffffff00;
  local_188 = &PTR__lazy_ostream_002ed980;
  local_178 = &boost::unit_test::lazy_ostream::inst;
  local_170 = &local_190;
  local_198 = &local_1a0;
  local_160 = 0;
  local_168 = &PTR__lazy_ostream_002ed980;
  local_158 = &boost::unit_test::lazy_ostream::inst;
  local_150 = &local_198;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_120);
  check_float_vectors(&pdf,&expected,0.0001);
  scode = exploration::
          sample_after_normalizing<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                    (0x1e6f,pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                     pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,&chosen_index);
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x1f);
  local_1a0 = 0;
  sStack_120.pi_ = (sp_counted_base *)0x0;
  local_190 = &scode;
  uStack_180 = uStack_180 & 0xffffffffffffff00;
  local_188 = &PTR__lazy_ostream_002ed980;
  local_178 = &boost::unit_test::lazy_ostream::inst;
  local_170 = &local_190;
  local_198 = &local_1a0;
  local_160 = 0;
  local_168 = &PTR__lazy_ostream_002ed980;
  local_158 = &boost::unit_test::lazy_ostream::inst;
  local_150 = &local_198;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_120);
  check_float_vectors(&pdf,&expected,0.0001);
  scode = exploration::
          sample_after_normalizing<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                    (0x1e6f,pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                     pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,&chosen_index);
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/explore_test.cc"
  ;
  local_b8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x23);
  local_1a0 = 0;
  sStack_120.pi_ = (sp_counted_base *)0x0;
  local_190 = &scode;
  uStack_180 = uStack_180 & 0xffffffffffffff00;
  local_188 = &PTR__lazy_ostream_002ed980;
  local_178 = &boost::unit_test::lazy_ostream::inst;
  local_170 = &local_190;
  local_198 = &local_1a0;
  local_160 = 0;
  local_168 = &PTR__lazy_ostream_002ed980;
  local_158 = &boost::unit_test::lazy_ostream::inst;
  local_150 = &local_198;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_120);
  check_float_vectors(&pdf,&expected,0.0001);
  if (expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(pdf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(sample_after_nomalizing_basic) {
  std::vector<float> pdf = { 1.0f, 2.0f, 3.0f, 4.0f, 5.0f };
  const std::vector<float> expected = { 0.066666667f,	0.133333333f,	0.2f,	0.266666667f,	0.333333333f };
  uint32_t chosen_index;

  auto scode = exploration::sample_after_normalizing(7791, begin(pdf), end(pdf), chosen_index);
  BOOST_CHECK_EQUAL(scode, S_EXPLORATION_OK);
  check_float_vectors(pdf, expected, .0001f);

  scode = exploration::sample_after_normalizing(7791, begin(pdf), end(pdf), chosen_index);
  BOOST_CHECK_EQUAL(scode, S_EXPLORATION_OK);
  check_float_vectors(pdf, expected, .0001f);

  scode = exploration::sample_after_normalizing(7791, begin(pdf), end(pdf), chosen_index);
  BOOST_CHECK_EQUAL(scode, S_EXPLORATION_OK);
  check_float_vectors(pdf, expected, .0001f);

  scode = exploration::sample_after_normalizing(7791, begin(pdf), end(pdf), chosen_index);
  BOOST_CHECK_EQUAL(scode, S_EXPLORATION_OK);
  check_float_vectors(pdf, expected, .0001f);

  scode = exploration::sample_after_normalizing(7791, begin(pdf), end(pdf), chosen_index);
  BOOST_CHECK_EQUAL(scode, S_EXPLORATION_OK);
  check_float_vectors(pdf, expected, .0001f);
}